

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O0

void display_map(int *cy,int *cx)

{
  monster_race *pmVar1;
  void *p;
  void *pvVar2;
  loc grid;
  uint8_t **mp;
  monster_race *race;
  wchar_t local_68;
  wchar_t wStack_64;
  uint8_t tp;
  wchar_t tc;
  wchar_t c;
  wchar_t ta;
  wchar_t a;
  grid_data g;
  wchar_t y;
  wchar_t x;
  wchar_t col;
  wchar_t row;
  wchar_t map_wid;
  wchar_t map_hgt;
  int *cx_local;
  int *cy_local;
  
  pmVar1 = r_info;
  _map_wid = cx;
  cx_local = cy;
  p = mem_zalloc((long)cave->height << 3);
  g.in_view = false;
  g.is_player = false;
  g.hallucinate = false;
  g._35_1_ = 0;
  for (; (int)g._32_4_ < cave->height; g._32_4_ = g._32_4_ + 1) {
    pvVar2 = mem_zalloc((long)cave->width);
    *(void **)((long)p + (long)(int)g._32_4_ * 8) = pvVar2;
  }
  get_minimap_dimensions
            ((term_conflict *)Term,(chunk *)cave,(uint)tile_width,(uint)tile_height,&col,&row);
  if ((col < L'\x01') || (row < L'\x01')) {
    g.in_view = false;
    g.is_player = false;
    g.hallucinate = false;
    g._35_1_ = 0;
    for (; (int)g._32_4_ < cave->height; g._32_4_ = g._32_4_ + 1) {
      mem_free(*(void **)((long)p + (long)(int)g._32_4_ * 8));
    }
    mem_free(p);
  }
  else {
    c = L'\x01';
    wStack_64 = L' ';
    tc = L'\x01';
    local_68 = L' ';
    window_make(L'\0',L'\0',col + L'\x01',row + L'\x01');
    if (col + L'\x01' < Term->wid + -1) {
      g.in_view = false;
      g.is_player = false;
      g.hallucinate = false;
      g._35_1_ = 0;
      for (; (int)g._32_4_ < row + L'\x01'; g._32_4_ = g._32_4_ + 1) {
        Term_erase(col + L'\x02',g._32_4_,(Term->wid - col) + L'\xfffffffe');
      }
    }
    if (row + L'\x01' < Term->hgt + -1) {
      for (g._32_4_ = row + L'\x02'; (int)g._32_4_ < Term->hgt; g._32_4_ = g._32_4_ + 1) {
        Term_erase(L'\0',g._32_4_,Term->wid);
      }
    }
    g.in_view = false;
    g.is_player = false;
    g.hallucinate = false;
    g._35_1_ = 0;
    for (; (int)g._32_4_ < cave->height; g._32_4_ = g._32_4_ + 1) {
      x = (g._32_4_ * row) / cave->height;
      if (1 < tile_height) {
        x = x - x % (int)(uint)tile_height;
      }
      for (g._36_4_ = 0; (int)g._36_4_ < cave->width; g._36_4_ = g._36_4_ + 1) {
        y = (g._36_4_ * col) / cave->width;
        if (1 < tile_width) {
          y = y - y % (int)(uint)tile_width;
        }
        grid = loc(g._36_4_,g._32_4_);
        map_info(grid,(grid_data *)&ta);
        grid_data_as_text((grid_data *)&ta,&c,&stack0xffffffffffffff9c,&tc,&local_68);
        race._7_1_ = f_info[(uint)a].priority;
        if ((c != tc) || (wStack_64 != local_68)) {
          race._7_1_ = 0x14;
        }
        if (*(byte *)(*(long *)((long)p + (long)x * 8) + (long)y) < race._7_1_) {
          g.trap._4_4_ = 2;
          grid_data_as_text((grid_data *)&ta,&c,&stack0xffffffffffffff9c,&tc,&local_68);
          Term_queue_char(Term,y + L'\x01',x + L'\x01',c,wStack_64,tc,local_68);
          if ((1 < tile_width) || (1 < tile_height)) {
            Term_big_queue_char(Term,y + L'\x01',x + L'\x01',Term->hgt + L'\xffffffff',L'ÿ',
                                L'\xffffffff',L'\0',L'\0');
          }
          *(byte *)(*(long *)((long)p + (long)x * 8) + (long)y) = race._7_1_;
        }
      }
    }
    x = ((player->grid).y * row) / cave->height;
    y = ((player->grid).x * col) / cave->width;
    if (1 < tile_width) {
      y = y - y % (int)(uint)tile_width;
    }
    if (1 < tile_height) {
      x = x - x % (int)(uint)tile_height;
    }
    map_info(player->grid,(grid_data *)&ta);
    g.trap._4_4_ = 2;
    grid_data_as_text((grid_data *)&ta,&c,&stack0xffffffffffffff9c,&tc,&local_68);
    c = (wchar_t)monster_x_attr[pmVar1->ridx];
    wStack_64 = monster_x_char[pmVar1->ridx];
    Term_queue_char(Term,y + L'\x01',x + L'\x01',c,wStack_64,tc,local_68);
    if ((1 < tile_width) || (1 < tile_height)) {
      Term_big_queue_char(Term,y + L'\x01',x + L'\x01',Term->hgt + L'\xffffffff',L'ÿ',L'\xffffffff'
                          ,L'\0',L'\0');
    }
    if (cx_local != (int *)0x0) {
      *cx_local = x + L'\x01';
    }
    if (_map_wid != (int *)0x0) {
      *_map_wid = y + L'\x01';
    }
    g.in_view = false;
    g.is_player = false;
    g.hallucinate = false;
    g._35_1_ = 0;
    for (; (int)g._32_4_ < cave->height; g._32_4_ = g._32_4_ + 1) {
      mem_free(*(void **)((long)p + (long)(int)g._32_4_ * 8));
    }
    mem_free(p);
  }
  return;
}

Assistant:

void display_map(int *cy, int *cx)
{
	int map_hgt, map_wid;
	int row, col;

	int x, y;
	struct grid_data g;

	int a, ta;
	wchar_t c, tc;

	uint8_t tp;

	struct monster_race *race = &r_info[0];

	/* Priority array */
	uint8_t **mp = mem_zalloc(cave->height * sizeof(uint8_t*));
	for (y = 0; y < cave->height; y++)
		mp[y] = mem_zalloc(cave->width * sizeof(uint8_t));

	/* Desired map height */
	get_minimap_dimensions(Term, cave, tile_width, tile_height,
		&map_wid, &map_hgt);

	/* Prevent accidents */
	if ((map_wid < 1) || (map_hgt < 1)) {
		for (y = 0; y < cave->height; y++)
			mem_free(mp[y]);
		mem_free(mp);
		return;
	}

	/* Nothing here */
	a = COLOUR_WHITE;
    c = L' ';
	ta = COLOUR_WHITE;
	tc = L' ';

	/* Draw a box around the edge of the term */
	window_make(0, 0, map_wid + 1, map_hgt + 1);

	/* Clear outside that boundary. */
	if (map_wid + 1 < Term->wid - 1) {
		for (y = 0; y < map_hgt + 1; y++) {
			Term_erase(map_wid + 2, y, Term->wid - map_wid - 2);
		}
	}
	if (map_hgt + 1 < Term->hgt - 1) {
		for (y = map_hgt + 2; y < Term->hgt; y++) {
			Term_erase(0, y, Term->wid);
		}
	}

	/* Analyze the actual map */
	for (y = 0; y < cave->height; y++) {
		row = (y * map_hgt) / cave->height;
		if (tile_height > 1) row = row - (row % tile_height);

		for (x = 0; x < cave->width; x++) {
			col = (x * map_wid) / cave->width;
			if (tile_width > 1) col = col - (col % tile_width);

			/* Get the attr/char at that map location */
			map_info(loc(x, y), &g);
			grid_data_as_text(&g, &a, &c, &ta, &tc);

			/* Get the priority of that attr/char */
			tp = f_info[g.f_idx].priority;

			/* Stuff on top of terrain gets higher priority */
			if ((a != ta) || (c != tc)) tp = 20;

			/* Save "best" */
			if (mp[row][col] < tp) {
				/* Hack - make every grid on the map lit */
				g.lighting = LIGHTING_LIT;
				grid_data_as_text(&g, &a, &c, &ta, &tc);

				Term_queue_char(Term, col + 1, row + 1, a, c, ta, tc);

				if ((tile_width > 1) || (tile_height > 1))
					Term_big_queue_char(Term, col + 1,
						row + 1, Term->hgt - 1,
						255, -1, 0, 0);

				/* Save priority */
				mp[row][col] = tp;
			}
		}
	}

	/*** Display the player ***/

	/* Player location */
	row = (player->grid.y * map_hgt / cave->height);
	col = (player->grid.x * map_wid / cave->width);

	if (tile_width > 1)
		col = col - (col % tile_width);
	if (tile_height > 1)
		row = row - (row % tile_height);

	/* Get the terrain at the player's spot. */
	map_info(player->grid, &g);
	g.lighting = LIGHTING_LIT;
	grid_data_as_text(&g, &a, &c, &ta, &tc);

	/* Get the "player" tile */
	a = monster_x_attr[race->ridx];
	c = monster_x_char[race->ridx];

	/* Draw the player */
	Term_queue_char(Term, col + 1, row + 1, a, c, ta, tc);

	if ((tile_width > 1) || (tile_height > 1))
		Term_big_queue_char(Term, col + 1, row + 1, Term->hgt - 1,
			255, -1, 0, 0);
  
	/* Return player location */
	if (cy != NULL) (*cy) = row + 1;
	if (cx != NULL) (*cx) = col + 1;

	for (y = 0; y < cave->height; y++)
		mem_free(mp[y]);
	mem_free(mp);
}